

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *file_00;
  Printer *printer_00;
  bool bVar1;
  int iVar2;
  string *filename_00;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar3;
  LogMessage *other;
  undefined1 local_230 [8];
  Printer printer;
  LogMessage local_1a0;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_168;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  FileDescriptorProto fdp;
  string filename;
  undefined1 local_58 [8];
  string module_name;
  MutexLock lock;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  internal::MutexLock::MutexLock((MutexLock *)((long)&module_name.field_2 + 8),&this->mutex_);
  this->file_ = file;
  filename_00 = FileDescriptor::name_abi_cxx11_(file);
  anon_unknown_0::ModuleName((string *)local_58,filename_00);
  std::__cxx11::string::string((string *)&fdp.source_code_info_,(string *)local_58);
  ReplaceCharacters((string *)&fdp.source_code_info_,".",'/');
  std::__cxx11::string::operator+=((string *)&fdp.source_code_info_,".py");
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&output);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)&output);
  MessageLite::SerializeToString((MessageLite *)&output,&this->file_descriptor_serialized_);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,&fdp.source_code_info_);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            (&local_168,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
  printer.annotation_collector_._7_1_ = 0;
  pZVar3 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_168);
  if (pZVar3 == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              (&local_1a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x14c);
    printer.annotation_collector_._7_1_ = 1;
    other = internal::LogMessage::operator<<(&local_1a0,"CHECK failed: output.get(): ");
    internal::LogFinisher::operator=
              ((LogFinisher *)((long)&printer.annotation_collector_ + 6),other);
  }
  if ((printer.annotation_collector_._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_1a0);
  }
  pZVar3 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_168);
  io::Printer::Printer((Printer *)local_230,pZVar3,'$');
  this->printer_ = (Printer *)local_230;
  file_00 = this->file_;
  printer_00 = this->printer_;
  bVar1 = GeneratingDescriptorProto(this);
  anon_unknown_0::PrintTopBoilerplate(printer_00,file_00,bVar1);
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  bVar1 = anon_unknown_0::HasGenericServices(file);
  if (bVar1) {
    PrintServices(this);
  }
  io::Printer::Print((Printer *)local_230,"# @@protoc_insertion_point(module_scope)\n");
  bVar1 = io::Printer::failed((Printer *)local_230);
  io::Printer::~Printer((Printer *)local_230);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_168);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&output);
  std::__cxx11::string::~string((string *)&fdp.source_code_info_);
  std::__cxx11::string::~string((string *)local_58);
  internal::MutexLock::~MutexLock((MutexLock *)((long)&module_name.field_2 + 8));
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}